

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  ulong nbCols;
  undefined1 auVar1 [16];
  long lVar2;
  undefined8 *puVar3;
  Index index;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  
  uVar4 = *(ulong *)other;
  nbCols = *(ulong *)(other + 8);
  bVar7 = nbCols == 0 || uVar4 == 0;
  if ((bVar7) ||
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar5 = SUB168(auVar1 % SEXT816((long)nbCols),0),
     (long)uVar4 <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | uVar4) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar7) ||
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar5 = SUB168(auVar1 % SEXT816((long)nbCols),0),
       (long)uVar4 <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar4,uVar4,nbCols);
      if ((*(long *)(this + 8) == *(long *)other) &&
         (*(long *)(this + 0x10) == *(long *)(other + 8))) {
        lVar2 = *(long *)(this + 0x10) * *(long *)(this + 8);
        uVar4 = lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar2) {
          lVar6 = 0;
          do {
            uVar5 = *(undefined8 *)(other + 0x10);
            puVar3 = (undefined8 *)(*(long *)this + lVar6 * 8);
            *puVar3 = uVar5;
            puVar3[1] = uVar5;
            lVar6 = lVar6 + 2;
          } while (lVar6 < (long)uVar4);
        }
        if ((long)uVar4 < lVar2) {
          lVar6 = *(long *)this;
          do {
            *(undefined8 *)(lVar6 + uVar4 * 8) = *(undefined8 *)(other + 0x10);
            uVar4 = uVar4 + 1;
          } while (lVar2 - uVar4 != 0);
        }
        return (Matrix<double,__1,__1,_0,__1,__1> *)this;
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8,bVar7,uVar5);
  *puVar3 = operator_delete;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }